

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O2

unsigned_long __thiscall internalJSONNode::operator_cast_to_unsigned_long(internalJSONNode *this)

{
  json_string *pjVar1;
  json_string *pjVar2;
  ulong uVar3;
  byte bVar4;
  unsigned_long uVar5;
  undefined1 auVar6 [16];
  allocator local_69;
  json_number local_68;
  undefined8 uStack_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  Fetch(this);
  bVar4 = this->_type;
  uVar5 = (unsigned_long)bVar4;
  if (bVar4 != 0) {
    if (bVar4 == 1) {
      FetchNumber(this);
      bVar4 = this->_type;
    }
    else if (bVar4 == 3) {
      return (ulong)(this->_value)._bool;
    }
    pjVar1 = jsonSingletonERROR_UNDEFINED::getValue_abi_cxx11_();
    std::operator+(&local_38,pjVar1,"(unsigned long)");
    JSONDebug::_JSON_ASSERT(bVar4 == 2,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    local_68 = (this->_value)._number;
    pjVar1 = &this->_string;
    pjVar2 = jsonSingletonERROR_LOWER_RANGE::getValue_abi_cxx11_();
    std::operator+(&local_58,pjVar1,pjVar2);
    std::operator+(&local_38,&local_58,"unsigned long");
    JSONDebug::_JSON_ASSERT(0.0 < local_68,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    local_68 = (this->_value)._number;
    pjVar2 = jsonSingletonERROR_UPPER_RANGE::getValue_abi_cxx11_();
    std::operator+(&local_58,pjVar1,pjVar2);
    std::operator+(&local_38,&local_58,"unsigned long");
    JSONDebug::_JSON_ASSERT(local_68 < 1.8446744073709552e+19,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    local_68 = (this->_value)._number;
    uStack_60 = 0;
    std::__cxx11::string::string((string *)&local_58,"(unsigend long) will truncate ",&local_69);
    std::operator+(&local_38,&local_58,pjVar1);
    uVar3 = (long)(local_68 - 9.223372036854776e+18) & (long)local_68 >> 0x3f | (long)local_68;
    auVar6._8_4_ = (int)(uVar3 >> 0x20);
    auVar6._0_8_ = uVar3;
    auVar6._12_4_ = 0x45300000;
    JSONDebug::_JSON_ASSERT
              ((bool)(-((auVar6._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0) == local_68)
                     & 1),&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    uVar3 = (ulong)(this->_value)._number;
    uVar5 = (long)((this->_value)._number - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
  }
  return uVar5;
}

Assistant:

internalJSONNode::operator unsigned long long() const json_nothrow
    #endif /*<- */
    {
	   Fetch();
	   #ifdef JSON_CASTABLE /*-> JSON_CASTABLE */
		  switch(type()){
			 case JSON_NULL:
				return 0;
			 case JSON_BOOL:
				return _value._bool ? 1 : 0;
			 case JSON_STRING:
				FetchNumber();
		  }
	   #endif /*<- */
	   #ifdef JSON_ISO_STRICT /*-> JSON_ISO_STRICT */
		  JSON_ASSERT(type() == JSON_NUMBER, json_global(ERROR_UNDEFINED) + JSON_TEXT("(unsigned long)"));
		  JSON_ASSERT(_value._number > 0, _string + json_global(ERROR_LOWER_RANGE) + JSON_TEXT("unsigned long"));
		  JSON_ASSERT(_value._number < ULONG_MAX, _string + json_global(ERROR_UPPER_RANGE) + JSON_TEXT("unsigned long"));
		  JSON_ASSERT(_value._number == (json_number)((unsigned long)_value._number), json_string(JSON_TEXT("(unsigend long) will truncate ")) + _string);
		  return (unsigned long)_value._number;
	   #else /*<- else */
		  JSON_ASSERT(type() == JSON_NUMBER, json_global(ERROR_UNDEFINED) + JSON_TEXT("(unsigned long long)"));
		  JSON_ASSERT(_value._number > 0, _string + json_global(ERROR_LOWER_RANGE) + JSON_TEXT("unsigned long long"));
		  #ifdef ULONG_LONG_MAX
			 JSON_ASSERT(_value._number < ULONG_LONG_MAX, _string + json_global(ERROR_UPPER_RANGE) + JSON_TEXT("unsigned long long"));
		  #elif defined(ULLONG_MAX)
			 JSON_ASSERT(_value._number < ULLONG_MAX, _string + json_global(ERROR_UPPER_RANGE) + JSON_TEXT("unsigned long long"));
		  #endif
		  JSON_ASSERT(_value._number == (json_number)((unsigned long long)_value._number), json_string(JSON_TEXT("(unsigned long long) will truncate ")) + _string);
		  return (unsigned long long)_value._number;
	   #endif /*<- */
    }